

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O3

bool storage::cc(int *arr,int cnt)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = true;
  if (1 < cnt) {
    if (arr[1] <= *arr) {
      return false;
    }
    uVar1 = 2;
    iVar2 = arr[1];
    do {
      uVar3 = uVar1;
      if ((uint)cnt == uVar3) break;
      bVar4 = iVar2 < arr[uVar3];
      uVar1 = uVar3 + 1;
      iVar2 = arr[uVar3];
    } while (bVar4);
    bVar4 = (uint)cnt <= uVar3;
  }
  return bVar4;
}

Assistant:

bool cc(int *arr, int cnt) {
        int cur = arr[0];
        bool ret = true;
        for (int i = 1; i < cnt; ++i) {
            if (arr[i] > cur)
                cur = arr[i];
            else
                return false;
        }
        return ret;
    }